

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverLines.cpp
# Opt level: O3

void fillRow1<float>(Matrix<float,_6,_1,_0,_6,_1> *l01,Matrix<float,_6,_1,_0,_6,_1> *l02,
                    Matrix<float,_6,_1,_0,_6,_1> *l11,Matrix<float,_6,_1,_0,_6,_1> *l12,
                    vector<float,_std::allocator<float>_> *c0,
                    vector<float,_std::allocator<float>_> *c1,
                    vector<float,_std::allocator<float>_> *c2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float *pfVar8;
  iterator iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  undefined1 local_a8 [16];
  float local_90;
  float local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar7 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar17 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c4 = (fVar7 * fVar11 * fVar5 +
             ((fVar6 * fVar7 * fVar4 + (fVar1 * fVar2 * fVar5 - fVar3 * fVar1 * fVar4)) -
             fVar2 * fVar6 * fVar17)) - fVar3 * fVar11 * fVar17;
  iVar9._M_current =
       (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  pfVar8 = (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c0,iVar9,&local_c4);
    iVar9._M_current =
         (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_c4 = (fVar1 + fVar1) *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] * fVar4 +
             fVar1 * -2.0 * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] +
             (fVar2 + fVar2) * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             fVar2 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] * fVar4;
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c0,iVar9,&local_c4);
    iVar9._M_current =
         (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar7 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar17 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c4 = fVar3 * fVar11 * fVar17 +
             ((fVar2 * fVar6 * fVar17 +
              ((fVar1 * fVar2 * fVar5 - fVar3 * fVar1 * fVar4) - fVar7 * fVar6 * fVar4)) -
             fVar7 * fVar11 * fVar5);
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c0,iVar9,&local_c4);
    iVar9._M_current =
         (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  local_c4 = fVar1 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] * fVar4 +
             (fVar1 + fVar1) * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] +
             (fVar2 + fVar2) *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2] * fVar4 +
             fVar2 * -2.0 * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c0,iVar9,&local_c4);
    iVar9._M_current =
         (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_c4 = fVar1 * -2.0 * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             (fVar1 + fVar1) *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] * fVar4 +
             fVar2 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2] * fVar4 +
             (fVar2 + fVar2) * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c0,iVar9,&local_c4);
    iVar9._M_current =
         (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar7 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar17 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c4 = fVar3 * fVar11 * fVar17 +
             (((fVar6 * fVar7 * fVar4 + (fVar1 * fVar3 * fVar4 - fVar2 * fVar1 * fVar5)) -
              fVar2 * fVar6 * fVar17) - fVar7 * fVar11 * fVar5);
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c0,iVar9,&local_c4);
    iVar9._M_current =
         (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_c4 = (fVar1 + fVar1) * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             fVar1 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] * fVar4 +
             fVar2 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2] * fVar4 +
             (fVar2 + fVar2) * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c0,iVar9,&local_c4);
    iVar9._M_current =
         (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  local_c4 = fVar1 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] * fVar4 +
             (fVar1 + fVar1) * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] +
             fVar2 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2] * fVar4 +
             (fVar2 + fVar2) * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c0,iVar9,&local_c4);
    iVar9._M_current =
         (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_c4 = fVar1 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] * fVar4 +
             (fVar1 + fVar1) * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] +
             (fVar2 + fVar2) * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             fVar2 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] * fVar4;
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c0,iVar9,&local_c4);
    iVar9._M_current =
         (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar7 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar17 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c4 = (fVar7 * fVar11 * fVar5 +
             fVar2 * fVar6 * fVar17 +
             ((fVar1 * fVar3 * fVar4 - fVar2 * fVar1 * fVar5) - fVar7 * fVar6 * fVar4)) -
             fVar3 * fVar11 * fVar17;
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c0,iVar9,&local_c4);
  }
  else {
    *iVar9._M_current = local_c4;
    (c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current + 1;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar7 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar17 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c4 = (fVar7 * fVar11 * fVar5 +
             (((fVar1 * fVar3 * fVar4 + fVar1 * fVar2 * fVar5) - fVar7 * fVar6 * fVar4) -
             fVar2 * fVar6 * fVar17)) - fVar3 * fVar11 * fVar17;
  iVar9._M_current =
       (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  pfVar8 = (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c1,iVar9,&local_c4);
    iVar9._M_current =
         (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar4 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_c4 = (fVar1 + fVar1) * fVar3 * fVar5 +
             (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] * -2.0 * fVar4 * fVar5 +
             (fVar2 + fVar2) * fVar4 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             fVar2 * -2.0 * fVar3 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0];
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c1,iVar9,&local_c4);
    iVar9._M_current =
         (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar7 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar17 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c4 = fVar3 * fVar11 * fVar17 +
             fVar7 * fVar11 * fVar5 +
             fVar2 * fVar6 * fVar17 +
             ((-fVar1 * fVar3 * fVar4 - fVar1 * fVar2 * fVar5) - fVar7 * fVar6 * fVar4);
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c1,iVar9,&local_c4);
    iVar9._M_current =
         (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar4 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  local_c4 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] * -2.0 * fVar3 * fVar5 +
             (fVar1 + fVar1) * fVar3 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] +
             (fVar2 + fVar2) * fVar4 * fVar5 +
             fVar1 * -2.0 * fVar4 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c1,iVar9,&local_c4);
    iVar9._M_current =
         (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  local_c4 = fVar4 * -2.0 * fVar1 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             (fVar4 + fVar4) * fVar2 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2] +
             (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2] * -2.0 * fVar2 * fVar3 + (fVar5 + fVar5) * fVar1 * fVar3;
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c1,iVar9,&local_c4);
    iVar9._M_current =
         (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar7 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar17 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c4 = ((fVar2 * fVar6 * fVar17 +
              fVar6 * fVar7 * fVar4 + (fVar1 * fVar3 * fVar4 - fVar2 * fVar1 * fVar5)) -
             fVar7 * fVar11 * fVar5) - fVar3 * fVar11 * fVar17;
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c1,iVar9,&local_c4);
    iVar9._M_current =
         (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0] * -2.0;
  local_c4 = fVar11 * fVar2 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             fVar3 * fVar11 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2] + (fVar1 + fVar1) * fVar3 * fVar4 + (fVar5 + fVar5) * fVar2 * fVar4;
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c1,iVar9,&local_c4);
    iVar9._M_current =
         (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1] * -2.0;
  fVar5 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_c4 = (fVar5 + fVar5) * fVar2 * fVar4 +
             fVar11 * fVar2 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] +
             (fVar1 + fVar1) * fVar3 * fVar4 +
             fVar3 * fVar11 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c1,iVar9,&local_c4);
    iVar9._M_current =
         (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2] * -2.0;
  fVar1 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar3 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_c4 = (fVar3 + fVar3) * fVar1 * fVar5 +
             (fVar4 + fVar4) * fVar2 * fVar5 +
             fVar11 * fVar2 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             fVar11 * fVar1 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0];
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c1,iVar9,&local_c4);
    iVar9._M_current =
         (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar7 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar17 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c4 = fVar3 * fVar11 * fVar17 +
             (((fVar6 * fVar7 * fVar4 + (fVar1 * fVar2 * fVar5 - fVar3 * fVar1 * fVar4)) -
              fVar2 * fVar6 * fVar17) - fVar7 * fVar11 * fVar5);
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c1,iVar9,&local_c4);
  }
  else {
    *iVar9._M_current = local_c4;
    (c1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current + 1;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar12 = fVar3 * -fVar1;
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  local_b8 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  local_a8 = ZEXT416((uint)fVar1);
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  local_b0 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  local_ac = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5];
  local_bc = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  local_c0 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4];
  local_68._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  local_88._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  fVar19 = -fVar1 * fVar2;
  fVar11 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  local_78._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  local_b4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[3];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar7 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar13 = fVar7 * -fVar6;
  fVar20 = -fVar6 * fVar2;
  fVar17 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar15 = fVar7 * -fVar17;
  fVar21 = -fVar17 * fVar3;
  local_c4 = fVar17 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[3] +
             (((fVar2 * (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage
                        .m_data.array[3] +
               (((fVar21 * local_b4 * local_bc +
                 fVar3 * fVar17 * local_c0 * (float)local_78._0_4_ +
                 fVar11 * fVar21 * local_b8 +
                 fVar5 * fVar3 * fVar17 * (float)local_88._0_4_ +
                 fVar15 * local_b4 * (float)local_68._0_4_ +
                 fVar7 * fVar17 * local_ac * (float)local_78._0_4_ +
                 fVar11 * fVar15 * local_b0 +
                 fVar4 * fVar7 * fVar17 * (float)local_88._0_4_ +
                 fVar20 * local_b4 * local_bc +
                 fVar2 * fVar6 * local_c0 * (float)local_78._0_4_ +
                 fVar11 * fVar20 * local_b8 +
                 fVar5 * fVar2 * fVar6 * (float)local_88._0_4_ +
                 fVar6 * fVar7 * local_c0 * (float)local_68._0_4_ +
                 fVar13 * local_ac * local_bc +
                 fVar5 * fVar13 * local_b0 +
                 fVar4 * fVar6 * fVar7 * local_b8 +
                 fVar19 * local_b4 * (float)local_68._0_4_ +
                 fVar1 * fVar2 * local_ac * (float)local_78._0_4_ +
                 fVar19 * fVar11 * local_b0 +
                 fVar4 * fVar1 * fVar2 * (float)local_88._0_4_ +
                 fVar12 * local_c0 * (float)local_68._0_4_ +
                 fVar1 * fVar3 * local_ac * local_bc +
                 fVar12 * fVar4 * local_b8 + fVar1 * fVar3 * fVar5 * local_b0) -
                fVar7 * (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage
                        .m_data.array[5]) -
               fVar3 * (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                       m_data.array[4])) -
              fVar1 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[5]) -
             fVar6 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                     m_data.array[4]);
  iVar9._M_current =
       (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  pfVar8 = (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c2,iVar9,&local_c4);
    iVar9._M_current =
         (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_c0 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar11 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar6 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar7 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  fVar17 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar16 = fVar17 + fVar17;
  fVar12 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_bc = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5];
  fVar13 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar15 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  fVar19 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  fVar20 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  fVar22 = fVar2 * fVar17 * -2.0;
  fVar21 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  fVar14 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar10 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar23 = fVar10 + fVar10;
  fVar24 = fVar10 * -2.0 * local_c0;
  fVar18 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  local_c4 = fVar23 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[4] +
             fVar16 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[3] +
             (fVar20 + fVar20) * fVar2 +
             (fVar18 + fVar18) * local_c0 +
             local_c0 * fVar23 * fVar15 * fVar14 +
             fVar24 * fVar21 * fVar13 +
             fVar4 * local_c0 * fVar23 * fVar6 +
             fVar7 * fVar24 * fVar11 +
             fVar12 * fVar10 * -2.0 * fVar21 * fVar19 +
             fVar12 * fVar23 * local_bc * fVar14 +
             fVar22 * fVar15 * fVar14 +
             fVar2 * fVar16 * fVar21 * fVar13 +
             fVar4 * fVar22 * fVar6 +
             fVar7 * fVar2 * fVar16 * fVar11 +
             fVar17 * -2.0 * fVar12 * fVar15 * fVar19 +
             fVar16 * fVar12 * local_bc * fVar13 +
             fVar1 * -2.0 * local_c0 * fVar7 * fVar5 +
             (fVar1 + fVar1) * local_c0 * fVar3 * fVar6 +
             (fVar1 + fVar1) * fVar2 * fVar3 * fVar11 + fVar1 * -2.0 * fVar2 * fVar4 * fVar5;
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c2,iVar9,&local_c4);
    iVar9._M_current =
         (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_b0 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  local_78._0_4_ = fVar2;
  local_ac = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5];
  local_b4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0];
  fVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  local_bc = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4];
  local_8c = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  local_88 = ZEXT416((uint)fVar1);
  fVar17 = fVar2 * -fVar1;
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  local_c0 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  local_b8 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4];
  fVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar15 = -fVar1 * local_b0;
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  local_90 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_68 = ZEXT416((uint)fVar6);
  fVar12 = local_90 * -fVar6;
  fVar7 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  local_48._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  local_58._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3];
  fVar20 = local_90 * -fVar11;
  fVar19 = -fVar11 * local_b0;
  fVar13 = -fVar6 * fVar2;
  local_c4 = (fVar11 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                       m_data.array[4] +
             (((fVar2 * (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage
                        .m_data.array[4] +
               ((fVar2 * fVar6 * (float)local_58._0_4_ * local_c0 +
                fVar13 * local_b8 * (float)local_48._0_4_ +
                fVar7 * fVar2 * fVar6 * fVar3 +
                local_bc * fVar13 * local_b4 +
                local_90 * fVar6 * (float)local_58._0_4_ * fVar5 +
                fVar12 * fVar4 * (float)local_48._0_4_ +
                fVar7 * fVar12 * local_8c +
                local_ac * local_90 * fVar6 * local_b4 +
                local_b0 * fVar11 * (float)local_58._0_4_ * local_c0 +
                fVar19 * local_b8 * (float)local_48._0_4_ +
                fVar7 * local_b0 * fVar11 * fVar3 +
                local_bc * fVar19 * local_b4 +
                fVar20 * local_b8 * fVar5 +
                fVar11 * local_90 * fVar4 * local_c0 +
                local_bc * fVar20 * local_8c +
                local_ac * fVar11 * local_90 * fVar3 +
                fVar15 * (float)local_58._0_4_ * fVar5 +
                fVar4 * fVar1 * local_b0 * (float)local_48._0_4_ +
                fVar1 * local_b0 * fVar7 * local_8c +
                local_ac * fVar15 * local_b4 +
                fVar17 * local_b8 * fVar5 +
                fVar1 * fVar2 * fVar4 * local_c0 +
                fVar1 * fVar2 * local_ac * fVar3 + fVar17 * local_bc * local_8c) -
               local_90 *
               (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
               array[5])) -
              local_b0 *
              (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[3]) -
             fVar1 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                     m_data.array[5])) -
             fVar6 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                     m_data.array[3];
  if (iVar9._M_current == pfVar8) {
    local_a8._0_4_ = fVar3;
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c2,iVar9,&local_c4);
    iVar9._M_current =
         (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar16 = fVar1 + fVar1;
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  local_bc = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  fVar22 = fVar1 * -2.0 * fVar2;
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_c0 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5];
  fVar11 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  local_a8._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  fVar6 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  fVar7 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar17 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  local_b8 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4];
  fVar12 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar13 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  fVar15 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  fVar19 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar20 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar21 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar18 = fVar21 + fVar21;
  fVar10 = fVar21 * -2.0 * fVar20;
  fVar14 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [5];
  local_c4 = fVar18 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[5] +
             fVar16 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[3] +
             (fVar15 + fVar15) * fVar2 +
             (fVar14 + fVar14) * fVar20 +
             fVar20 * fVar18 * fVar6 * fVar7 +
             fVar10 * local_c0 * fVar11 +
             fVar4 * fVar20 * fVar18 * local_bc +
             fVar3 * fVar10 * fVar5 +
             fVar17 * fVar18 * local_b8 * fVar7 +
             fVar17 * fVar21 * -2.0 * local_c0 * (float)local_a8._0_4_ +
             (fVar12 + fVar12) * fVar20 * fVar13 * local_bc +
             fVar12 * -2.0 * fVar20 * fVar3 * fVar19 +
             fVar2 * fVar12 * -2.0 * fVar4 * fVar19 +
             fVar2 * (fVar12 + fVar12) * fVar13 * fVar5 +
             fVar1 * -2.0 * fVar17 * fVar6 * (float)local_a8._0_4_ +
             fVar16 * fVar17 * local_b8 * fVar11 +
             fVar22 * fVar6 * fVar7 +
             fVar16 * fVar2 * local_c0 * fVar11 +
             fVar16 * fVar2 * fVar3 * fVar5 + fVar22 * fVar4 * local_bc;
  pfVar8 = (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c2,iVar9,&local_c4);
    iVar9._M_current =
         (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar14 = fVar1 + fVar1;
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  local_b4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  local_c0 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4];
  local_bc = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  fVar10 = fVar1 * -2.0 * fVar2;
  local_b8 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar11 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  local_a8._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  fVar6 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar7 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  fVar17 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar12 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar16 = fVar17 * -2.0 * fVar12;
  fVar13 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar18 = fVar17 + fVar17;
  fVar15 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  fVar19 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar20 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  fVar21 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [5];
  local_c4 = fVar18 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[5] +
             fVar14 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[4] +
             (fVar15 + fVar15) * fVar2 +
             (fVar21 + fVar21) * fVar12 +
             (fVar13 + fVar13) * fVar12 * fVar20 * local_bc +
             fVar13 * -2.0 * fVar12 * fVar3 * fVar19 +
             fVar2 * (fVar13 + fVar13) * fVar20 * local_b4 +
             fVar2 * fVar13 * -2.0 * local_c0 * fVar19 +
             fVar6 * fVar18 * fVar7 * (float)local_a8._0_4_ +
             fVar17 * -2.0 * fVar6 * local_b8 * fVar4 +
             fVar18 * fVar12 * fVar11 * (float)local_a8._0_4_ +
             fVar16 * local_b8 * fVar5 +
             local_c0 * fVar18 * fVar12 * local_bc +
             fVar3 * fVar16 * local_b4 +
             fVar14 * fVar6 * fVar7 * fVar5 +
             fVar1 * -2.0 * fVar6 * fVar11 * fVar4 +
             fVar10 * fVar11 * (float)local_a8._0_4_ +
             fVar14 * fVar2 * local_b8 * fVar5 +
             fVar14 * fVar2 * fVar3 * local_b4 + fVar10 * local_c0 * local_bc;
  if (iVar9._M_current == pfVar8) {
    local_88._0_4_ = fVar4;
    local_78._0_4_ = fVar7;
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c2,iVar9,&local_c4);
    iVar9._M_current =
         (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar19 = fVar3 * -fVar1;
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  local_a8._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  local_b8 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  local_b0 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  local_b4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5];
  local_bc = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  local_c0 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4];
  local_ac = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  local_68._0_4_ = fVar2;
  fVar12 = -fVar1 * fVar2;
  fVar11 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  local_88._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  local_78._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar7 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar13 = fVar7 * -fVar6;
  fVar21 = -fVar6 * fVar2;
  fVar17 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar20 = fVar7 * -fVar17;
  fVar15 = -fVar17 * fVar3;
  local_c4 = ((fVar1 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                       m_data.array[5] +
              (((fVar7 * (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
                         m_storage.m_data.array[5] +
                fVar3 * fVar17 * (float)local_78._0_4_ * local_bc +
                fVar15 * local_c0 * (float)local_88._0_4_ +
                fVar11 * fVar15 * local_b8 +
                fVar5 * fVar3 * fVar17 * (float)local_a8._0_4_ +
                fVar7 * fVar17 * (float)local_78._0_4_ * local_ac +
                fVar20 * local_b4 * (float)local_88._0_4_ +
                fVar11 * fVar7 * fVar17 * local_b0 +
                fVar4 * fVar20 * (float)local_a8._0_4_ +
                fVar21 * (float)local_78._0_4_ * local_bc +
                fVar2 * fVar6 * local_c0 * (float)local_88._0_4_ +
                fVar11 * fVar2 * fVar6 * local_b8 +
                fVar5 * fVar21 * (float)local_a8._0_4_ +
                fVar6 * fVar7 * local_c0 * local_ac +
                fVar13 * local_b4 * local_bc +
                fVar5 * fVar6 * fVar7 * local_b0 +
                fVar4 * fVar13 * local_b8 +
                fVar1 * fVar2 * (float)local_78._0_4_ * local_ac +
                fVar12 * local_b4 * (float)local_88._0_4_ +
                fVar1 * fVar2 * fVar11 * local_b0 +
                fVar4 * fVar12 * (float)local_a8._0_4_ +
                fVar1 * fVar3 * local_c0 * local_ac +
                fVar19 * local_b4 * local_bc +
                fVar19 * fVar4 * local_b8 + fVar1 * fVar3 * fVar5 * local_b0) -
               fVar3 * (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                       m_data.array[4]) -
              fVar2 * (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[3])) -
             fVar6 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                     m_data.array[4]) -
             fVar17 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[3];
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c2,iVar9,&local_c4);
    iVar9._M_current =
         (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar15 = fVar1 * -2.0 * fVar2;
  fVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar21 = fVar1 + fVar1;
  local_c0 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4];
  local_bc = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  local_b8 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5];
  local_88._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  local_b0 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  local_78._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  local_a8._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  fVar5 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_b4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[3];
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar20 = fVar11 * -2.0;
  fVar6 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar7 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar19 = (fVar11 + fVar11) * fVar6;
  fVar17 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar12 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  fVar13 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [5];
  local_c4 = fVar20 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[5] +
             fVar21 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[4] +
             (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4] * -2.0 * fVar2 +
             (fVar13 + fVar13) * fVar6 +
             (fVar7 + fVar7) * fVar6 * fVar12 * local_bc +
             fVar7 * -2.0 * fVar6 * fVar3 * fVar17 +
             fVar2 * fVar7 * -2.0 * fVar12 * fVar4 +
             fVar2 * (fVar7 + fVar7) * local_c0 * fVar17 +
             fVar5 * fVar20 * local_b4 * (float)local_a8._0_4_ +
             fVar5 * (fVar11 + fVar11) * local_b8 * (float)local_88._0_4_ +
             fVar20 * fVar6 * (float)local_78._0_4_ * (float)local_a8._0_4_ +
             fVar19 * local_b8 * local_b0 +
             local_c0 * fVar19 * local_bc +
             fVar3 * fVar20 * fVar6 * fVar4 +
             fVar21 * fVar5 * local_b4 * local_b0 +
             fVar1 * -2.0 * fVar5 * (float)local_78._0_4_ * (float)local_88._0_4_ +
             fVar15 * (float)local_78._0_4_ * (float)local_a8._0_4_ +
             fVar21 * fVar2 * local_b8 * local_b0 +
             fVar15 * fVar3 * fVar4 + fVar21 * fVar2 * local_c0 * local_bc;
  pfVar8 = (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c2,iVar9,&local_c4);
    iVar9._M_current =
         (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar16 = (fVar1 + fVar1) * fVar2;
  fVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  local_bc = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  fVar10 = fVar1 * -2.0;
  local_b8 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0];
  fVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  fVar11 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  local_a8._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  fVar6 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  fVar7 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar17 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  local_c0 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4];
  fVar12 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar13 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  fVar15 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  fVar19 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar20 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar21 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar18 = fVar21 + fVar21;
  fVar14 = fVar21 * -2.0 * fVar20;
  local_c4 = fVar18 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[5] +
             fVar10 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[3] +
             (fVar15 + fVar15) * fVar2 +
             (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5] * -2.0 * fVar20 +
             fVar20 * fVar18 * fVar6 * fVar7 +
             fVar14 * fVar5 * fVar11 +
             fVar4 * fVar14 * local_bc +
             fVar3 * fVar20 * fVar18 * local_b8 +
             fVar17 * fVar18 * local_c0 * fVar7 +
             fVar17 * fVar21 * -2.0 * fVar5 * (float)local_a8._0_4_ +
             fVar12 * -2.0 * fVar20 * fVar13 * local_bc +
             (fVar12 + fVar12) * fVar20 * fVar3 * fVar19 +
             fVar2 * fVar12 * -2.0 * fVar4 * fVar19 +
             fVar2 * (fVar12 + fVar12) * fVar13 * local_b8 +
             (fVar1 + fVar1) * fVar17 * fVar6 * (float)local_a8._0_4_ +
             fVar10 * fVar17 * local_c0 * fVar11 +
             fVar16 * fVar6 * fVar7 +
             fVar10 * fVar2 * fVar5 * fVar11 +
             fVar16 * fVar3 * local_b8 + fVar10 * fVar2 * fVar4 * local_bc;
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c2,iVar9,&local_c4);
    iVar9._M_current =
         (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  fVar11 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  fVar6 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_bc = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  fVar7 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  fVar17 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar10 = fVar17 + fVar17;
  fVar12 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c0 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5];
  fVar13 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar15 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  local_b8 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  fVar22 = fVar3 * fVar17 * -2.0;
  fVar19 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar16 = fVar19 * -2.0;
  fVar20 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  fVar21 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar18 = (fVar19 + fVar19) * fVar2;
  fVar14 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  local_c4 = fVar16 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[4] +
             fVar10 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[3] +
             (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[3] * -2.0 * fVar3 +
             (fVar14 + fVar14) * fVar2 +
             fVar2 * fVar16 * fVar15 * fVar21 +
             fVar18 * fVar20 * fVar13 +
             fVar5 * fVar18 * local_bc +
             fVar7 * fVar2 * fVar16 * fVar6 +
             fVar12 * (fVar19 + fVar19) * fVar20 * local_b8 +
             fVar12 * fVar16 * local_c0 * fVar21 +
             fVar22 * fVar15 * fVar21 +
             fVar3 * fVar10 * fVar20 * fVar13 +
             fVar5 * fVar3 * fVar10 * local_bc +
             fVar7 * fVar22 * fVar6 +
             fVar17 * -2.0 * fVar12 * fVar15 * local_b8 +
             fVar10 * fVar12 * local_c0 * fVar13 +
             fVar1 * -2.0 * fVar2 * fVar7 * fVar11 +
             (fVar1 + fVar1) * fVar2 * fVar4 * local_bc +
             fVar1 * -2.0 * fVar3 * fVar4 * fVar6 + (fVar1 + fVar1) * fVar3 * fVar5 * fVar11;
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c2,iVar9,&local_c4);
    iVar9._M_current =
         (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    pfVar8 = (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  }
  else {
    *iVar9._M_current = local_c4;
    iVar9._M_current = iVar9._M_current + 1;
    (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current;
  }
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_b8 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0];
  local_b4 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  local_8c = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5];
  local_b0 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  local_c0 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4];
  fVar2 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_88._0_4_ = fVar2;
  local_78 = ZEXT416((uint)fVar1);
  fVar19 = local_b4 * -fVar1;
  fVar3 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  local_ac = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  local_bc = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_a8._0_4_ = fVar4;
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_68._0_4_ = fVar5;
  fVar14 = -fVar1 * local_b8;
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  local_90 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_58 = ZEXT416((uint)fVar6);
  fVar7 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  fVar17 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar12 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  local_48 = ZEXT416((uint)fVar11);
  fVar20 = local_90 * -fVar11;
  fVar15 = -fVar11 * local_b8;
  fVar13 = local_90 * -fVar6;
  fVar21 = -fVar6 * local_b4;
  local_c4 = fVar6 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                     m_data.array[3] +
             fVar11 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[4] +
             fVar1 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                     m_data.array[5] +
             local_b8 *
             (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[3] +
             local_b4 *
             (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4] +
             local_90 *
             (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5] +
             fVar21 * fVar12 * local_ac +
             local_b4 * fVar6 * local_bc * fVar17 +
             fVar7 * local_b4 * fVar6 * local_b0 +
             local_c0 * fVar21 * fVar5 +
             fVar13 * fVar12 * fVar4 +
             local_90 * fVar6 * fVar3 * fVar17 +
             fVar7 * local_90 * fVar6 * fVar2 +
             local_8c * fVar13 * fVar5 +
             local_b8 * fVar11 * fVar12 * local_ac +
             fVar15 * local_bc * fVar17 +
             fVar7 * fVar15 * local_b0 +
             local_c0 * local_b8 * fVar11 * fVar5 +
             fVar20 * local_bc * fVar4 +
             fVar11 * local_90 * fVar3 * local_ac +
             local_c0 * fVar11 * local_90 * fVar2 +
             local_8c * fVar20 * local_b0 +
             fVar1 * local_b8 * fVar12 * fVar4 +
             fVar3 * fVar14 * fVar17 +
             fVar14 * fVar7 * fVar2 +
             local_8c * fVar1 * local_b8 * fVar5 +
             fVar1 * local_b4 * local_bc * fVar4 +
             fVar19 * fVar3 * local_ac +
             fVar1 * local_b4 * local_8c * local_b0 + fVar19 * local_c0 * fVar2;
  if (iVar9._M_current == pfVar8) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>(c2,iVar9,&local_c4);
  }
  else {
    *iVar9._M_current = local_c4;
    (c2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar9._M_current + 1;
  }
  return;
}

Assistant:

void fillRow1(const Eigen::Matrix<floatPrec,6,1> & l01,
    const Eigen::Matrix<floatPrec,6,1> & l02,
    const Eigen::Matrix<floatPrec,6,1> & l11,
    const Eigen::Matrix<floatPrec,6,1> & l12,
    std::vector<floatPrec> & c0,
    std::vector<floatPrec> & c1,
    std::vector<floatPrec> & c2 )
{
  c0.push_back(-l12[2]*l11[1]*l01[0]+l12[2]*l11[0]*l01[1]+l12[1]*l11[2]*l01[0]-l12[1]*l11[0]*l01[2]+l12[0]*l11[2]*l01[1]-l12[0]*l11[1]*l01[2]);
  c0.push_back(2*l12[1]*l11[2]*l01[1]-2*l12[1]*l11[1]*l01[2]-2*l12[0]*l11[2]*l01[0]+2*l12[0]*l11[0]*l01[2]);
  c0.push_back(-l12[2]*l11[1]*l01[0]+l12[2]*l11[0]*l01[1]-l12[1]*l11[2]*l01[0]+l12[1]*l11[0]*l01[2]-l12[0]*l11[2]*l01[1]+l12[0]*l11[1]*l01[2]);
  c0.push_back(2*l12[2]*l11[2]*l01[1]-2*l12[2]*l11[1]*l01[2]+2*l12[0]*l11[1]*l01[0]-2*l12[0]*l11[0]*l01[1]);
  c0.push_back(-2*l12[2]*l11[2]*l01[0]+2*l12[2]*l11[0]*l01[2]+2*l12[1]*l11[1]*l01[0]-2*l12[1]*l11[0]*l01[1]);
  c0.push_back(l12[2]*l11[1]*l01[0]-l12[2]*l11[0]*l01[1]+l12[1]*l11[2]*l01[0]-l12[1]*l11[0]*l01[2]-l12[0]*l11[2]*l01[1]+l12[0]*l11[1]*l01[2]);
  c0.push_back(-2*l12[2]*l11[2]*l01[0]+2*l12[2]*l11[0]*l01[2]-2*l12[1]*l11[1]*l01[0]+2*l12[1]*l11[0]*l01[1]);
  c0.push_back(-2*l12[2]*l11[2]*l01[1]+2*l12[2]*l11[1]*l01[2]+2*l12[0]*l11[1]*l01[0]-2*l12[0]*l11[0]*l01[1]);
  c0.push_back(2*l12[1]*l11[2]*l01[1]-2*l12[1]*l11[1]*l01[2]+2*l12[0]*l11[2]*l01[0]-2*l12[0]*l11[0]*l01[2]);
  c0.push_back(l12[2]*l11[1]*l01[0]-l12[2]*l11[0]*l01[1]-l12[1]*l11[2]*l01[0]+l12[1]*l11[0]*l01[2]+l12[0]*l11[2]*l01[1]-l12[0]*l11[1]*l01[2]);
  c1.push_back(l12[2]*l11[1]*l02[0]+l12[2]*l11[0]*l02[1]-l12[1]*l11[2]*l02[0]-l12[1]*l11[0]*l02[2]+l12[0]*l11[2]*l02[1]-l12[0]*l11[1]*l02[2]);
  c1.push_back(2*l12[2]*l11[1]*l02[1]-2*l12[2]*l11[0]*l02[0]-2*l12[1]*l11[1]*l02[2]+2*l12[0]*l11[0]*l02[2]);
  c1.push_back(-l12[2]*l11[1]*l02[0]-l12[2]*l11[0]*l02[1]-l12[1]*l11[2]*l02[0]+l12[1]*l11[0]*l02[2]+l12[0]*l11[2]*l02[1]+l12[0]*l11[1]*l02[2]);
  c1.push_back(2*l12[2]*l11[2]*l02[1]-2*l12[1]*l11[2]*l02[2]+2*l12[1]*l11[0]*l02[0]-2*l12[0]*l11[0]*l02[1]);
  c1.push_back(-2*l12[2]*l11[2]*l02[0]+2*l12[1]*l11[1]*l02[0]+2*l12[0]*l11[2]*l02[2]-2*l12[0]*l11[1]*l02[1]);
  c1.push_back(l12[2]*l11[1]*l02[0]-l12[2]*l11[0]*l02[1]+l12[1]*l11[2]*l02[0]+l12[1]*l11[0]*l02[2]-l12[0]*l11[2]*l02[1]-l12[0]*l11[1]*l02[2]);
  c1.push_back(2*l12[2]*l11[2]*l02[0]+2*l12[1]*l11[1]*l02[0]-2*l12[0]*l11[2]*l02[2]-2*l12[0]*l11[1]*l02[1]);
  c1.push_back(2*l12[2]*l11[2]*l02[1]-2*l12[1]*l11[2]*l02[2]-2*l12[1]*l11[0]*l02[0]+2*l12[0]*l11[0]*l02[1]);
  c1.push_back(-2*l12[2]*l11[1]*l02[1]-2*l12[2]*l11[0]*l02[0]+2*l12[1]*l11[1]*l02[2]+2*l12[0]*l11[0]*l02[2]);
  c1.push_back(-l12[2]*l11[1]*l02[0]+l12[2]*l11[0]*l02[1]+l12[1]*l11[2]*l02[0]-l12[1]*l11[0]*l02[2]-l12[0]*l11[2]*l02[1]+l12[0]*l11[1]*l02[2]);
  c2.push_back(-l12[2]*l11[1]*l02[5]*l02[1]+l12[2]*l11[1]*l02[4]*l02[2]+l12[2]*l11[1]*l01[5]*l01[1]-l12[2]*l11[1]*l01[4]*l01[2]+l12[2]*l11[0]*l02[5]*l02[0]-l12[2]*l11[0]*l02[3]*l02[2]+l12[2]*l11[0]*l01[5]*l01[0]-l12[2]*l11[0]*l01[3]*l01[2]+l12[1]*l11[2]*l02[5]*l02[1]-l12[1]*l11[2]*l02[4]*l02[2]-l12[1]*l11[2]*l01[5]*l01[1]+l12[1]*l11[2]*l01[4]*l01[2]+l12[1]*l11[0]*l02[4]*l02[0]-l12[1]*l11[0]*l02[3]*l02[1]+l12[1]*l11[0]*l01[4]*l01[0]-l12[1]*l11[0]*l01[3]*l01[1]+l12[0]*l11[2]*l02[5]*l02[0]-l12[0]*l11[2]*l02[3]*l02[2]+l12[0]*l11[2]*l01[5]*l01[0]-l12[0]*l11[2]*l01[3]*l01[2]+l12[0]*l11[1]*l02[4]*l02[0]-l12[0]*l11[1]*l02[3]*l02[1]+l12[0]*l11[1]*l01[4]*l01[0]-l12[0]*l11[1]*l01[3]*l01[1]-l12[5]*l11[2]-l12[4]*l11[1]+l12[3]*l11[0]-l12[2]*l11[5]-l12[1]*l11[4]+l12[0]*l11[3]);
  c2.push_back(2*l12[2]*l11[1]*l02[5]*l02[0]-2*l12[2]*l11[1]*l02[3]*l02[2]+2*l12[2]*l11[0]*l02[5]*l02[1]-2*l12[2]*l11[0]*l02[4]*l02[2]+2*l12[1]*l11[2]*l01[5]*l01[0]-2*l12[1]*l11[2]*l01[3]*l01[2]+2*l12[1]*l11[1]*l02[4]*l02[0]-2*l12[1]*l11[1]*l02[3]*l02[1]+2*l12[1]*l11[1]*l01[4]*l01[0]-2*l12[1]*l11[1]*l01[3]*l01[1]+2*l12[0]*l11[2]*l01[5]*l01[1]-2*l12[0]*l11[2]*l01[4]*l01[2]-2*l12[0]*l11[0]*l02[4]*l02[0]+2*l12[0]*l11[0]*l02[3]*l02[1]-2*l12[0]*l11[0]*l01[4]*l01[0]+2*l12[0]*l11[0]*l01[3]*l01[1]+2*l12[4]*l11[0]+2*l12[3]*l11[1]+2*l12[1]*l11[3]+2*l12[0]*l11[4]);
  c2.push_back(l12[2]*l11[1]*l02[5]*l02[1]-l12[2]*l11[1]*l02[4]*l02[2]+l12[2]*l11[1]*l01[5]*l01[1]-l12[2]*l11[1]*l01[4]*l01[2]-l12[2]*l11[0]*l02[5]*l02[0]+l12[2]*l11[0]*l02[3]*l02[2]+l12[2]*l11[0]*l01[5]*l01[0]-l12[2]*l11[0]*l01[3]*l01[2]+l12[1]*l11[2]*l02[5]*l02[1]-l12[1]*l11[2]*l02[4]*l02[2]+l12[1]*l11[2]*l01[5]*l01[1]-l12[1]*l11[2]*l01[4]*l01[2]-l12[1]*l11[0]*l02[4]*l02[0]+l12[1]*l11[0]*l02[3]*l02[1]-l12[1]*l11[0]*l01[4]*l01[0]+l12[1]*l11[0]*l01[3]*l01[1]+l12[0]*l11[2]*l02[5]*l02[0]-l12[0]*l11[2]*l02[3]*l02[2]-l12[0]*l11[2]*l01[5]*l01[0]+l12[0]*l11[2]*l01[3]*l01[2]-l12[0]*l11[1]*l02[4]*l02[0]+l12[0]*l11[1]*l02[3]*l02[1]-l12[0]*l11[1]*l01[4]*l01[0]+l12[0]*l11[1]*l01[3]*l01[1]-l12[5]*l11[2]+l12[4]*l11[1]-l12[3]*l11[0]-l12[2]*l11[5]+l12[1]*l11[4]-l12[0]*l11[3]);
  c2.push_back(2*l12[2]*l11[2]*l02[5]*l02[0]-2*l12[2]*l11[2]*l02[3]*l02[2]+2*l12[2]*l11[2]*l01[5]*l01[0]-2*l12[2]*l11[2]*l01[3]*l01[2]+2*l12[2]*l11[1]*l01[4]*l01[0]-2*l12[2]*l11[1]*l01[3]*l01[1]+2*l12[1]*l11[2]*l02[4]*l02[0]-2*l12[1]*l11[2]*l02[3]*l02[1]-2*l12[1]*l11[0]*l02[5]*l02[1]+2*l12[1]*l11[0]*l02[4]*l02[2]-2*l12[0]*l11[1]*l01[5]*l01[1]+2*l12[0]*l11[1]*l01[4]*l01[2]-2*l12[0]*l11[0]*l02[5]*l02[0]+2*l12[0]*l11[0]*l02[3]*l02[2]-2*l12[0]*l11[0]*l01[5]*l01[0]+2*l12[0]*l11[0]*l01[3]*l01[2]+2*l12[5]*l11[0]+2*l12[3]*l11[2]+2*l12[2]*l11[3]+2*l12[0]*l11[5]);
  c2.push_back(2*l12[2]*l11[2]*l02[5]*l02[1]-2*l12[2]*l11[2]*l02[4]*l02[2]+2*l12[2]*l11[2]*l01[5]*l01[1]-2*l12[2]*l11[2]*l01[4]*l01[2]-2*l12[2]*l11[0]*l01[4]*l01[0]+2*l12[2]*l11[0]*l01[3]*l01[1]-2*l12[1]*l11[1]*l02[5]*l02[1]+2*l12[1]*l11[1]*l02[4]*l02[2]-2*l12[1]*l11[1]*l01[5]*l01[1]+2*l12[1]*l11[1]*l01[4]*l01[2]-2*l12[1]*l11[0]*l01[5]*l01[0]+2*l12[1]*l11[0]*l01[3]*l01[2]-2*l12[0]*l11[2]*l02[4]*l02[0]+2*l12[0]*l11[2]*l02[3]*l02[1]-2*l12[0]*l11[1]*l02[5]*l02[0]+2*l12[0]*l11[1]*l02[3]*l02[2]+2*l12[5]*l11[1]+2*l12[4]*l11[2]+2*l12[2]*l11[4]+2*l12[1]*l11[5]);
  c2.push_back(-l12[2]*l11[1]*l02[5]*l02[1]+l12[2]*l11[1]*l02[4]*l02[2]-l12[2]*l11[1]*l01[5]*l01[1]+l12[2]*l11[1]*l01[4]*l01[2]-l12[2]*l11[0]*l02[5]*l02[0]+l12[2]*l11[0]*l02[3]*l02[2]-l12[2]*l11[0]*l01[5]*l01[0]+l12[2]*l11[0]*l01[3]*l01[2]-l12[1]*l11[2]*l02[5]*l02[1]+l12[1]*l11[2]*l02[4]*l02[2]-l12[1]*l11[2]*l01[5]*l01[1]+l12[1]*l11[2]*l01[4]*l01[2]-l12[1]*l11[0]*l02[4]*l02[0]+l12[1]*l11[0]*l02[3]*l02[1]+l12[1]*l11[0]*l01[4]*l01[0]-l12[1]*l11[0]*l01[3]*l01[1]-l12[0]*l11[2]*l02[5]*l02[0]+l12[0]*l11[2]*l02[3]*l02[2]-l12[0]*l11[2]*l01[5]*l01[0]+l12[0]*l11[2]*l01[3]*l01[2]+l12[0]*l11[1]*l02[4]*l02[0]-l12[0]*l11[1]*l02[3]*l02[1]-l12[0]*l11[1]*l01[4]*l01[0]+l12[0]*l11[1]*l01[3]*l01[1]+l12[5]*l11[2]-l12[4]*l11[1]-l12[3]*l11[0]+l12[2]*l11[5]-l12[1]*l11[4]-l12[0]*l11[3]);
  c2.push_back(-2*l12[2]*l11[2]*l02[5]*l02[1]+2*l12[2]*l11[2]*l02[4]*l02[2]+2*l12[2]*l11[2]*l01[5]*l01[1]-2*l12[2]*l11[2]*l01[4]*l01[2]-2*l12[2]*l11[0]*l01[4]*l01[0]+2*l12[2]*l11[0]*l01[3]*l01[1]-2*l12[1]*l11[1]*l02[5]*l02[1]+2*l12[1]*l11[1]*l02[4]*l02[2]+2*l12[1]*l11[1]*l01[5]*l01[1]-2*l12[1]*l11[1]*l01[4]*l01[2]+2*l12[1]*l11[0]*l01[5]*l01[0]-2*l12[1]*l11[0]*l01[3]*l01[2]+2*l12[0]*l11[2]*l02[4]*l02[0]-2*l12[0]*l11[2]*l02[3]*l02[1]-2*l12[0]*l11[1]*l02[5]*l02[0]+2*l12[0]*l11[1]*l02[3]*l02[2]+2*l12[5]*l11[1]-2*l12[4]*l11[2]+2*l12[2]*l11[4]-2*l12[1]*l11[5]);
  c2.push_back(2*l12[2]*l11[2]*l02[5]*l02[0]-2*l12[2]*l11[2]*l02[3]*l02[2]-2*l12[2]*l11[2]*l01[5]*l01[0]+2*l12[2]*l11[2]*l01[3]*l01[2]-2*l12[2]*l11[1]*l01[4]*l01[0]+2*l12[2]*l11[1]*l01[3]*l01[1]+2*l12[1]*l11[2]*l02[4]*l02[0]-2*l12[1]*l11[2]*l02[3]*l02[1]+2*l12[1]*l11[0]*l02[5]*l02[1]-2*l12[1]*l11[0]*l02[4]*l02[2]-2*l12[0]*l11[1]*l01[5]*l01[1]+2*l12[0]*l11[1]*l01[4]*l01[2]+2*l12[0]*l11[0]*l02[5]*l02[0]-2*l12[0]*l11[0]*l02[3]*l02[2]-2*l12[0]*l11[0]*l01[5]*l01[0]+2*l12[0]*l11[0]*l01[3]*l01[2]-2*l12[5]*l11[0]+2*l12[3]*l11[2]-2*l12[2]*l11[3]+2*l12[0]*l11[5]);
  c2.push_back(-2*l12[2]*l11[1]*l02[5]*l02[0]+2*l12[2]*l11[1]*l02[3]*l02[2]+2*l12[2]*l11[0]*l02[5]*l02[1]-2*l12[2]*l11[0]*l02[4]*l02[2]+2*l12[1]*l11[2]*l01[5]*l01[0]-2*l12[1]*l11[2]*l01[3]*l01[2]-2*l12[1]*l11[1]*l02[4]*l02[0]+2*l12[1]*l11[1]*l02[3]*l02[1]+2*l12[1]*l11[1]*l01[4]*l01[0]-2*l12[1]*l11[1]*l01[3]*l01[1]-2*l12[0]*l11[2]*l01[5]*l01[1]+2*l12[0]*l11[2]*l01[4]*l01[2]-2*l12[0]*l11[0]*l02[4]*l02[0]+2*l12[0]*l11[0]*l02[3]*l02[1]+2*l12[0]*l11[0]*l01[4]*l01[0]-2*l12[0]*l11[0]*l01[3]*l01[1]+2*l12[4]*l11[0]-2*l12[3]*l11[1]+2*l12[1]*l11[3]-2*l12[0]*l11[4]);
  c2.push_back(l12[2]*l11[1]*l02[5]*l02[1]-l12[2]*l11[1]*l02[4]*l02[2]-l12[2]*l11[1]*l01[5]*l01[1]+l12[2]*l11[1]*l01[4]*l01[2]+l12[2]*l11[0]*l02[5]*l02[0]-l12[2]*l11[0]*l02[3]*l02[2]-l12[2]*l11[0]*l01[5]*l01[0]+l12[2]*l11[0]*l01[3]*l01[2]-l12[1]*l11[2]*l02[5]*l02[1]+l12[1]*l11[2]*l02[4]*l02[2]+l12[1]*l11[2]*l01[5]*l01[1]-l12[1]*l11[2]*l01[4]*l01[2]+l12[1]*l11[0]*l02[4]*l02[0]-l12[1]*l11[0]*l02[3]*l02[1]-l12[1]*l11[0]*l01[4]*l01[0]+l12[1]*l11[0]*l01[3]*l01[1]-l12[0]*l11[2]*l02[5]*l02[0]+l12[0]*l11[2]*l02[3]*l02[2]+l12[0]*l11[2]*l01[5]*l01[0]-l12[0]*l11[2]*l01[3]*l01[2]-l12[0]*l11[1]*l02[4]*l02[0]+l12[0]*l11[1]*l02[3]*l02[1]+l12[0]*l11[1]*l01[4]*l01[0]-l12[0]*l11[1]*l01[3]*l01[1]+l12[5]*l11[2]+l12[4]*l11[1]+l12[3]*l11[0]+l12[2]*l11[5]+l12[1]*l11[4]+l12[0]*l11[3]);
}